

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::FieldDescriptor::is_packed(FieldDescriptor *this)

{
  bool bVar1;
  Syntax SVar2;
  bool local_22;
  bool local_21;
  FieldDescriptor *this_local;
  
  bVar1 = is_packable(this);
  if (bVar1) {
    SVar2 = FileDescriptor::syntax(*(FileDescriptor **)(this + 0x30));
    if (SVar2 == SYNTAX_PROTO2) {
      local_21 = false;
      if (*(long *)(this + 0x80) != 0) {
        local_21 = FieldOptions::packed(*(FieldOptions **)(this + 0x80));
      }
      this_local._7_1_ = local_21;
    }
    else {
      local_22 = true;
      if (*(long *)(this + 0x80) != 0) {
        bVar1 = FieldOptions::has_packed(*(FieldOptions **)(this + 0x80));
        local_22 = true;
        if (bVar1) {
          local_22 = FieldOptions::packed(*(FieldOptions **)(this + 0x80));
        }
      }
      this_local._7_1_ = local_22;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FieldDescriptor::is_packed() const {
  if (!is_packable()) return false;
  if (file_->syntax() == FileDescriptor::SYNTAX_PROTO2) {
    return (options_ != NULL) && options_->packed();
  } else {
    return options_ == NULL || !options_->has_packed() || options_->packed();
  }
}